

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void flatbuffers::tests::UnicodeSurrogatesTest(void)

{
  bool expval;
  ushort uVar1;
  uint *puVar2;
  int *piVar3;
  Parser parser;
  IDLOptions IStack_a98;
  Parser local_788;
  
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  IDLOptions::~IDLOptions(&IStack_a98);
  expval = Parser::Parse(&local_788,
                         "table T { F:string (id: 0); }root_type T;{ F:\"\\uD83D\\uDCA9\"}",
                         (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse(\"table T { F:string (id: 0); }\" \"root_type T;\" \"{ F:\\\"\\\\uD83D\\\\uDCA9\\\"}\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x31c,"");
  puVar2 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&local_788.builder_);
  if (puVar2 == (uint *)0x0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)((ulong)*puVar2 + (long)puVar2);
  }
  if (*(ushort *)((long)piVar3 - (long)*piVar3) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)piVar3 + (4 - (long)*piVar3));
  }
  TestEqStr((char *)((long)piVar3 + (ulong)*(uint *)((long)piVar3 + (ulong)uVar1) + (ulong)uVar1 + 4
                    ),anon_var_dwarf_4391a0,"\'string->c_str()\' != \'\"\\xF0\\x9F\\x92\\xA9\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x321,"");
  Parser::~Parser(&local_788);
  return;
}

Assistant:

void UnicodeSurrogatesTest() {
  flatbuffers::Parser parser;

  TEST_EQ(parser.Parse("table T { F:string (id: 0); }"
                       "root_type T;"
                       "{ F:\"\\uD83D\\uDCA9\"}"),
          true);
  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  auto string = root->GetPointer<flatbuffers::String *>(
      flatbuffers::FieldIndexToOffset(0));
  TEST_EQ_STR(string->c_str(), "\xF0\x9F\x92\xA9");
}